

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImGuiWindow *pIVar1;
  ImGuiViewportP *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImVec2 mx;
  ImVec2 IVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar3 = GImGui;
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar1 = GImGui->NavWindow, pIVar1 != (ImGuiWindow *)0x0)) {
    auVar7._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar6 = pIVar1->NavRectRel[GImGui->NavLayer].Min;
    IVar5 = pIVar1->NavRectRel[GImGui->NavLayer].Max;
    fVar10 = IVar5.y;
    fVar9 = IVar6.x;
    auVar7._4_4_ = (GImGui->Style).FramePadding.y;
    auVar7._8_8_ = 0;
    auVar8._4_4_ = fVar10 - IVar6.y;
    auVar8._0_4_ = IVar5.x - fVar9;
    auVar8._8_8_ = 0;
    auVar8 = minps(auVar7,auVar8);
    local_18.x = (pIVar1->Pos).x + fVar9 + auVar8._0_4_;
    local_18.y = (pIVar1->Pos).y + (fVar10 - auVar8._4_4_);
    pIVar2 = pIVar1->Viewport;
    IVar6 = (pIVar2->super_ImGuiViewport).Pos;
    IVar5 = (pIVar2->super_ImGuiViewport).Size;
    mx.x = IVar5.x + IVar6.x;
    mx.y = IVar5.y + IVar6.y;
    IVar5 = ImClamp(&local_18,&(pIVar2->super_ImGuiViewport).Pos,mx);
    IVar6.x = (float)(int)IVar5.x;
    IVar6.y = (float)(int)IVar5.y;
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar4 = IsMousePosValid(mouse_pos);
    if (bVar4) {
      IVar6 = *mouse_pos;
    }
    else {
      IVar6 = pIVar3->MouseLastValidPos;
    }
  }
  return IVar6;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.MouseLastValidPos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = g.NavWindow->Viewport;
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}